

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_store_elim_pass.cpp
# Opt level: O2

Status __thiscall
spvtools::opt::LocalSingleStoreElimPass::ProcessImpl(LocalSingleStoreElimPass *this)

{
  bool bVar1;
  FeatureManager *pFVar2;
  Status SVar3;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  pFVar2 = IRContext::get_feature_mgr((this->super_Pass).context_);
  bVar1 = EnumSet<spv::Capability>::contains(&pFVar2->capabilities_,Addresses);
  SVar3 = SuccessWithoutChange;
  if (!bVar1) {
    bVar1 = AllExtensionsSupported(this);
    if (bVar1) {
      local_38._8_8_ = 0;
      local_20 = std::
                 _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/local_single_store_elim_pass.cpp:74:25)>
                 ::_M_invoke;
      local_28 = std::
                 _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/local_single_store_elim_pass.cpp:74:25)>
                 ::_M_manager;
      local_38._M_unused._M_object = this;
      bVar1 = IRContext::ProcessReachableCallTree
                        ((this->super_Pass).context_,(ProcessFunction *)&local_38);
      if (local_28 != (code *)0x0) {
        (*local_28)(&local_38,&local_38,__destroy_functor);
      }
      SVar3 = bVar1 ^ SuccessWithoutChange;
    }
  }
  return SVar3;
}

Assistant:

Pass::Status LocalSingleStoreElimPass::ProcessImpl() {
  // Assumes relaxed logical addressing only (see instruction.h)
  if (context()->get_feature_mgr()->HasCapability(spv::Capability::Addresses))
    return Status::SuccessWithoutChange;

  // Do not process if any disallowed extensions are enabled
  if (!AllExtensionsSupported()) return Status::SuccessWithoutChange;
  // Process all entry point functions
  ProcessFunction pfn = [this](Function* fp) {
    return LocalSingleStoreElim(fp);
  };
  bool modified = context()->ProcessReachableCallTree(pfn);
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}